

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-dis.c
# Opt level: O0

easm_expr * dis_parse_expr(disctx *ctx,dis_status *status,int *spos)

{
  int iVar1;
  litem **pplVar2;
  easm_sinsn *sinsn;
  easm_expr *res;
  int *spos_local;
  dis_status *status_local;
  disctx *ctx_local;
  
  if (ctx->atomsnum <= *spos) {
    abort();
  }
  if (ctx->atoms[*spos]->type == LITEM_EXPR) {
    pplVar2 = ctx->atoms;
    iVar1 = *spos;
    *spos = iVar1 + 1;
    ctx_local = (disctx *)pplVar2[iVar1]->expr;
  }
  else {
    pplVar2 = ctx->atoms;
    iVar1 = *spos;
    *spos = iVar1 + 1;
    if (pplVar2[iVar1]->type != LITEM_SESTART) {
      abort();
    }
    sinsn = dis_parse_sinsn(ctx,status,spos);
    ctx_local = (disctx *)easm_expr_sinsn(sinsn);
    pplVar2 = ctx->atoms;
    iVar1 = *spos;
    *spos = iVar1 + 1;
    if (pplVar2[iVar1]->type != LITEM_SEEND) {
      abort();
    }
  }
  return (easm_expr *)ctx_local;
}

Assistant:

static struct easm_expr *dis_parse_expr(struct disctx *ctx, enum dis_status *status, int *spos) {
	if (*spos >= ctx->atomsnum)
		abort();
	if (ctx->atoms[*spos]->type == LITEM_EXPR)
		return ctx->atoms[(*spos)++]->expr;
	if (ctx->atoms[(*spos)++]->type != LITEM_SESTART)
		abort();
	struct easm_expr *res = easm_expr_sinsn(dis_parse_sinsn(ctx, status, spos));
	if (ctx->atoms[(*spos)++]->type != LITEM_SEEND)
		abort();
	return res;
}